

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border.cpp
# Opt level: O1

Element __thiscall ftxui::borderDashed(ftxui *this,Element *child)

{
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Element EVar3;
  Elements local_58;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  Elements local_30;
  
  local_40 = (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38 = (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  unpack<std::shared_ptr<ftxui::Node>>
            (&local_58,(ftxui *)&local_40,(shared_ptr<ftxui::Node> *)local_38);
  puVar1 = (undefined8 *)operator_new(0x80);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_0011f558;
  local_30.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_30.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  anon_unknown_0::Border::Border
            ((Border *)(puVar1 + 2),&local_30,DASHED,(optional<ftxui::Color>)0x0);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_30);
  *(Border **)this = (Border *)(puVar1 + 2);
  *(undefined8 **)(this + 8) = puVar1;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_58);
  _Var2._M_pi = extraout_RDX;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    _Var2._M_pi = extraout_RDX_00;
  }
  EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element borderDashed(Element child) {
  return std::make_shared<Border>(unpack(std::move(child)), DASHED);
}